

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

wchar_t ma_itoa_s(wchar_t value,char *dst,size_t dstSizeInBytes,wchar_t radix)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  bool local_3f;
  char temp;
  char *pcStack_38;
  wchar_t remainder;
  char *dstEnd;
  uint valueU;
  wchar_t sign;
  wchar_t radix_local;
  size_t dstSizeInBytes_local;
  char *dst_local;
  wchar_t value_local;
  
  if ((dst == (char *)0x0) || (dstSizeInBytes == 0)) {
    dst_local._4_4_ = L'\x16';
  }
  else if ((radix < L'\x02') || (L'$' < radix)) {
    *dst = '\0';
    dst_local._4_4_ = L'\x16';
  }
  else {
    iVar2 = 1;
    if (value < L'\0' && radix == L'\n') {
      iVar2 = -1;
    }
    pcVar3 = dst;
    dstEnd._4_4_ = value;
    sVar4 = dstSizeInBytes;
    if (value < L'\0') {
      dstEnd._4_4_ = -value;
      pcVar3 = dst;
      sVar4 = dstSizeInBytes;
    }
    do {
      _sign = sVar4;
      pcStack_38 = pcVar3;
      cVar1 = (char)((uint)dstEnd._4_4_ % (uint)radix);
      if ((int)((uint)dstEnd._4_4_ % (uint)radix) < 10) {
        *pcStack_38 = cVar1 + '0';
      }
      else {
        *pcStack_38 = cVar1 + 'W';
      }
      pcVar3 = pcStack_38 + 1;
      sVar4 = _sign - 1;
      dstEnd._4_4_ = (uint)dstEnd._4_4_ / (uint)radix;
      local_3f = sVar4 != 0 && dstEnd._4_4_ != L'\0';
    } while (local_3f);
    if (sVar4 == 0) {
      *dst = '\0';
      dst_local._4_4_ = L'\x16';
    }
    else {
      if (iVar2 < 0) {
        *pcVar3 = '-';
        pcVar3 = pcStack_38 + 2;
        sVar4 = _sign - 2;
      }
      _sign = sVar4;
      pcStack_38 = pcVar3;
      if (_sign == 0) {
        *dst = '\0';
        dst_local._4_4_ = L'\x16';
      }
      else {
        *pcStack_38 = '\0';
        for (dstSizeInBytes_local = (size_t)dst; pcStack_38 = pcStack_38 + -1,
            dstSizeInBytes_local < pcStack_38; dstSizeInBytes_local = dstSizeInBytes_local + 1) {
          cVar1 = *(char *)dstSizeInBytes_local;
          *(char *)dstSizeInBytes_local = *pcStack_38;
          *pcStack_38 = cVar1;
        }
        dst_local._4_4_ = L'\0';
      }
    }
  }
  return dst_local._4_4_;
}

Assistant:

MA_API int ma_itoa_s(int value, char* dst, size_t dstSizeInBytes, int radix)
{
    int sign;
    unsigned int valueU;
    char* dstEnd;

    if (dst == NULL || dstSizeInBytes == 0) {
        return 22;
    }
    if (radix < 2 || radix > 36) {
        dst[0] = '\0';
        return 22;
    }

    sign = (value < 0 && radix == 10) ? -1 : 1;     /* The negative sign is only used when the base is 10. */

    if (value < 0) {
        valueU = -value;
    } else {
        valueU = value;
    }

    dstEnd = dst;
    do
    {
        int remainder = valueU % radix;
        if (remainder > 9) {
            *dstEnd = (char)((remainder - 10) + 'a');
        } else {
            *dstEnd = (char)(remainder + '0');
        }

        dstEnd += 1;
        dstSizeInBytes -= 1;
        valueU /= radix;
    } while (dstSizeInBytes > 0 && valueU > 0);

    if (dstSizeInBytes == 0) {
        dst[0] = '\0';
        return 22;  /* Ran out of room in the output buffer. */
    }

    if (sign < 0) {
        *dstEnd++ = '-';
        dstSizeInBytes -= 1;
    }

    if (dstSizeInBytes == 0) {
        dst[0] = '\0';
        return 22;  /* Ran out of room in the output buffer. */
    }

    *dstEnd = '\0';


    /* At this point the string will be reversed. */
    dstEnd -= 1;
    while (dst < dstEnd) {
        char temp = *dst;
        *dst = *dstEnd;
        *dstEnd = temp;

        dst += 1;
        dstEnd -= 1;
    }

    return 0;
}